

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall APlayerPawn::AddInventory(APlayerPawn *this,AInventory *item)

{
  player_t *ppVar1;
  APlayerPawn *pAVar2;
  AInventory *pAVar3;
  
  ppVar1 = (this->super_AActor).player;
  if ((ppVar1 != (player_t *)0x0) &&
     (pAVar2 = ppVar1->mo, pAVar2 != (APlayerPawn *)0x0 && pAVar2 != this)) {
    (*(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x19])(pAVar2,item);
    return;
  }
  AActor::AddInventory(&this->super_AActor,item);
  pAVar3 = (this->InvSel).field_0.p;
  if (pAVar3 != (AInventory *)0x0) {
    if (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      return;
    }
    (this->InvSel).field_0.p = (AInventory *)0x0;
  }
  if ((item->ItemFlags & 0x40) != 0) {
    (this->InvSel).field_0.p = item;
  }
  return;
}

Assistant:

void APlayerPawn::AddInventory (AInventory *item)
{
	// Adding inventory to a voodoo doll should add it to the real player instead.
	if (player != NULL && player->mo != this && player->mo != NULL)
	{
		player->mo->AddInventory (item);
		return;
	}
	Super::AddInventory (item);

	// If nothing is selected, select this item.
	if (InvSel == NULL && (item->ItemFlags & IF_INVBAR))
	{
		InvSel = item;
	}
}